

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O0

void map2json_freePairsMemory(map2json_keyvalue_t *pair)

{
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    map2json_freePairsMemory((map2json_keyvalue_t *)0x10354b);
    free((void *)*in_RDI);
    free((void *)in_RDI[1]);
    free(in_RDI);
  }
  return;
}

Assistant:

static void map2json_freePairsMemory(map2json_keyvalue_t *pair) {
	DEBUG_PUT("map2json_freePairsMemory([map2json_t *])... ");
	if ( pair == NULL ) {
		DEBUG_PUT("map2json_freePairsMemory([map2json_t *])... DONE");
		return;
	}
	map2json_freePairsMemory(pair->next);
	free(pair->key);
	free(pair->value);
	free(pair);
	DEBUG_PUT("map2json_freePairsMemory([map2json_t *])... DONE");
}